

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.cpp
# Opt level: O1

void CJobPool::WorkerThread(void *pUser)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  long lVar3;
  
  if (*(char *)((long)pUser + 0x108) == '\0') {
    do {
      lock_wait(*(LOCK *)((long)pUser + 0x110));
      lVar3 = *(long *)((long)pUser + 0x118);
      if (lVar3 == 0) {
        lVar3 = 0;
      }
      else {
        puVar2 = *(undefined8 **)(lVar3 + 8);
        *(undefined8 **)((long)pUser + 0x118) = puVar2;
        if (puVar2 == (undefined8 *)0x0) {
          puVar2 = (undefined8 *)((long)pUser + 0x120);
        }
        *puVar2 = 0;
      }
      lock_unlock(*(LOCK *)((long)pUser + 0x110));
      if (lVar3 == 0) {
        thread_sleep(10);
      }
      else {
        *(undefined4 *)(lVar3 + 0x10) = 1;
        uVar1 = (**(code **)(lVar3 + 0x18))(*(undefined8 *)(lVar3 + 0x20));
        *(undefined4 *)(lVar3 + 0x14) = uVar1;
        *(undefined4 *)(lVar3 + 0x10) = 2;
      }
    } while (*(char *)((long)pUser + 0x108) != '\x01');
  }
  return;
}

Assistant:

void CJobPool::WorkerThread(void *pUser)
{
	CJobPool *pPool = (CJobPool *)pUser;

	while(!pPool->m_Shutdown)
	{
		CJob *pJob = 0;

		// fetch job from queue
		lock_wait(pPool->m_Lock);
		if(pPool->m_pFirstJob)
		{
			pJob = pPool->m_pFirstJob;
			pPool->m_pFirstJob = pPool->m_pFirstJob->m_pNext;
			if(pPool->m_pFirstJob)
				pPool->m_pFirstJob->m_pPrev = 0;
			else
				pPool->m_pLastJob = 0;
		}
		lock_unlock(pPool->m_Lock);

		// do the job if we have one
		if(pJob)
		{
			pJob->m_Status = CJob::STATE_RUNNING;
			pJob->m_Result = pJob->m_pfnFunc(pJob->m_pFuncData);
			pJob->m_Status = CJob::STATE_DONE;
		}
		else
			thread_sleep(10);
	}

}